

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O1

void __thiscall ncnn::Gemm_x86_avx::Gemm_x86_avx(Gemm_x86_avx *this)

{
  Gemm::Gemm((Gemm *)&this->field_0xe8);
  this->_vptr_Gemm_x86_avx = (_func_int **)0x62f1b0;
  *(undefined8 *)&this->field_0xe8 = 0x62f228;
  (this->CT_data).cstep = 0;
  (this->AT_data).data = (void *)0x0;
  (this->AT_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->AT_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->AT_data).elemsize + 4) = 0;
  (this->AT_data).allocator = (Allocator *)0x0;
  (this->AT_data).dims = 0;
  (this->AT_data).w = 0;
  (this->AT_data).w = 0;
  (this->AT_data).h = 0;
  (this->AT_data).d = 0;
  (this->AT_data).c = 0;
  (this->AT_data).cstep = 0;
  (this->BT_data).data = (void *)0x0;
  (this->BT_data).refcount = (int *)0x0;
  (this->BT_data).elemsize = 0;
  (this->BT_data).elempack = 0;
  (this->BT_data).allocator = (Allocator *)0x0;
  (this->BT_data).dims = 0;
  (this->BT_data).w = 0;
  (this->BT_data).w = 0;
  (this->BT_data).h = 0;
  (this->BT_data).d = 0;
  (this->BT_data).c = 0;
  (this->BT_data).cstep = 0;
  (this->CT_data).data = (void *)0x0;
  (this->CT_data).refcount = (int *)0x0;
  (this->CT_data).elemsize = 0;
  (this->CT_data).elempack = 0;
  (this->CT_data).allocator = (Allocator *)0x0;
  (this->CT_data).dims = 0;
  (this->CT_data).w = 0;
  (this->CT_data).w = 0;
  (this->CT_data).h = 0;
  (this->CT_data).d = 0;
  (this->CT_data).c = 0;
  this->field_0xf3 = 1;
  this->nT = 0;
  return;
}

Assistant:

Gemm_x86_avx::Gemm_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    nT = 0;
}